

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa_common.h
# Opt level: O3

void play_floatbuffer(snd_pcm_t *device,snd_pcm_format_t format,size_t period_size,float preamp,
                     float *buffer,void *alsabuffer)

{
  undefined1 *alsabuffer_00;
  size_t sVar1;
  snd_pcm_format_t format_00;
  snd_pcm_t *psVar2;
  xm_context_t *pxVar3;
  float *pfVar4;
  byte bVar5;
  uint8_t uVar6;
  _Bool _Var7;
  char cVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  ushort channel;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  undefined4 extraout_var;
  time_t tVar16;
  size_t __len;
  char *pcVar17;
  float *pfVar18;
  size_t extraout_RDX;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  float *pfVar23;
  long lVar24;
  char **ppcVar25;
  ulong uVar26;
  undefined2 uVar27;
  ulong uVar28;
  ulong uVar29;
  bool loopcnt;
  float extraout_XMM0_Da;
  float fVar30;
  float fVar31;
  ulong auStackY_1d8 [7];
  undefined8 uStack_188;
  float fStack_180;
  undefined2 uStack_17b;
  undefined4 uStack_179;
  undefined2 uStack_175;
  size_t sStack_138;
  ulong uStack_130;
  ulong uStack_128;
  ulong uStack_120;
  undefined1 *puStack_118;
  ulong uStack_110;
  ulong uStack_108;
  ulong uStack_100;
  undefined1 *puStack_f8;
  snd_pcm_t *psStack_f0;
  size_t sStack_e8;
  float *pfStack_e0;
  ulong uStack_d8;
  uint uStack_d0;
  snd_pcm_format_t sStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  float fStack_b8;
  float fStack_b4;
  ulong uStack_b0;
  ulong uStack_a8;
  uint64_t uStack_a0;
  ulong uStack_98;
  snd_pcm_t *psStack_90;
  ulong uStack_88;
  ushort uStack_7c;
  ushort uStack_7a;
  uint uStack_78;
  float fStack_74;
  ulong uStack_70;
  uint16_t uStack_62;
  ulong uStack_60;
  char **ppcStack_58;
  byte bStack_4a;
  byte bStack_49;
  xm_context_t *pxStack_48;
  byte bStack_39;
  snd_pcm_t *psStack_38;
  
  if (((format == SND_PCM_FORMAT_FLOAT) && (preamp == 1.0)) && (!NAN(preamp))) {
    format = snd_pcm_writei(device,buffer);
    if (SND_PCM_FORMAT_UNKNOWN < format) {
      return;
    }
    iVar11 = snd_pcm_recover(device,format,0);
    if (-1 < iVar11) {
      return;
    }
    play_floatbuffer_cold_2();
    period_size = extraout_RDX;
    preamp = extraout_XMM0_Da;
  }
  if (format == SND_PCM_FORMAT_S16) {
    if (period_size * 2 != 0) {
      lVar24 = 0;
      do {
        fVar30 = buffer[lVar24] * preamp;
        uVar27 = 0x7fff;
        if ((fVar30 <= 1.0) && (uVar27 = 0x8001, -1.0 <= fVar30)) {
          uVar27 = (undefined2)(int)(fVar30 * 32767.0);
        }
        *(undefined2 *)((long)alsabuffer + lVar24 * 2) = uVar27;
        lVar24 = lVar24 + 1;
      } while (period_size * 2 != lVar24);
    }
  }
  else if (format == SND_PCM_FORMAT_S32) {
    if (period_size * 2 != 0) {
      lVar24 = 0;
      do {
        fVar30 = buffer[lVar24] * preamp;
        iVar11 = 0x7fffffff;
        if ((fVar30 <= 1.0) && (iVar11 = -0x7fffffff, -1.0 <= fVar30)) {
          iVar11 = (int)(fVar30 * 2.1474836e+09);
        }
        *(int *)((long)alsabuffer + lVar24 * 4) = iVar11;
        lVar24 = lVar24 + 1;
      } while (period_size * 2 != lVar24);
    }
  }
  else if ((format == SND_PCM_FORMAT_FLOAT) && (period_size * 2 != 0)) {
    lVar24 = 0;
    do {
      *(float *)((long)alsabuffer + lVar24 * 4) = buffer[lVar24] * preamp;
      lVar24 = lVar24 + 1;
    } while (period_size * 2 != lVar24);
  }
  uVar12 = snd_pcm_writei(device,alsabuffer);
  if (-1 < (int)uVar12) {
    return;
  }
  ppcVar25 = (char **)(ulong)uVar12;
  uVar12 = snd_pcm_recover(device,ppcVar25,0);
  if (-1 < (int)uVar12) {
    return;
  }
  play_floatbuffer_cold_1();
  pfVar18 = &fStack_180;
  pfVar23 = &fStack_180;
  uStack_a0 = 0;
  pfVar4 = &fStack_180;
  psStack_38 = device;
  if (uVar12 != 1) {
    pcVar17 = ppcVar25[1];
    if (((*pcVar17 != '-') || (pcVar17[1] != 'h')) || (pfVar4 = &fStack_180, pcVar17[2] != '\0')) {
      uStack_188 = 0x10386d;
      ppcStack_58 = ppcVar25;
      iVar11 = strcmp(pcVar17,"--help");
      pfVar4 = &fStack_180;
      if (iVar11 != 0) {
        uStack_88 = (ulong)(int)uVar12;
        if (uVar12 == 0) {
          fStack_74 = 1.0;
          uVar15 = 1;
          uVar29 = 1;
          iVar11 = 0;
        }
        else {
          uVar29 = 1;
          fStack_74 = 1.0;
          uStack_60 = 0;
          uVar15 = 1;
          uStack_70 = (ulong)uVar12;
          do {
            pcVar17 = ppcStack_58[uVar15];
            if (((*pcVar17 == '-') && (pcVar17[1] == '-')) && (pcVar17[2] == '\0')) {
              uVar15 = uVar15 + 1;
              goto LAB_001039ed;
            }
            uStack_188 = 0x1038e2;
            iVar11 = strcmp(pcVar17,"--preamp");
            if (iVar11 == 0) {
              uVar22 = uVar15 + 1;
              if (uVar22 == uStack_88) goto LAB_001043c6;
              uStack_188 = 0x103998;
              fStack_74 = strtof(ppcStack_58[uVar15 + 1],(char **)0x0);
            }
            else {
              uStack_188 = 0x1038f5;
              iVar11 = strcmp(pcVar17,"--loop");
              if (iVar11 == 0) {
                uVar22 = uVar15 + 1;
                if (uVar22 == uStack_88) goto LAB_001043e7;
                uStack_188 = 0x1039c1;
                uVar29 = strtol(ppcStack_58[uVar15 + 1],(char **)0x0,0);
              }
              else {
                uStack_188 = 0x10390c;
                iVar11 = strcmp(pcVar17,"--random");
                if (iVar11 == 0) {
                  uStack_60 = CONCAT71((int7)(CONCAT44(extraout_var,iVar11) >> 8),1);
                  uVar22 = uVar15;
                }
                else {
                  uStack_188 = 0x103923;
                  iVar11 = strcmp(pcVar17,"--device");
                  if (iVar11 != 0) {
                    uStack_188 = 0x103936;
                    iVar11 = strcmp(pcVar17,"--buffer-size");
                    if (iVar11 != 0) {
                      uStack_188 = 0x103949;
                      iVar11 = strcmp(pcVar17,"--period-size");
                      if (iVar11 != 0) {
                        uStack_188 = 0x10395c;
                        iVar11 = strcmp(pcVar17,"--rate");
                        if (iVar11 != 0) {
                          uStack_188 = 0x10396f;
                          iVar11 = strcmp(pcVar17,"--format");
                          if (iVar11 != 0) goto LAB_001039e6;
                        }
                      }
                    }
                  }
                  uVar22 = uVar15 + 1;
                }
              }
            }
            uVar15 = uVar22 + 1;
          } while (uVar15 < uStack_88);
          uVar15 = 1;
LAB_001039e6:
LAB_001039ed:
          iVar11 = (int)uStack_70;
          if (((byte)uStack_60 & 1) != 0) {
            uStack_188 = 0x1039fa;
            tVar16 = time((time_t *)0x0);
            uStack_188 = 0x103a01;
            srand((uint)tVar16);
            ppcVar25 = ppcStack_58;
            uVar22 = (ulong)(iVar11 + -1);
            if (uVar15 < uVar22) {
              do {
                uStack_188 = 0x103a23;
                iVar11 = rand();
                uVar19 = (ulong)(long)iVar11 % ((1 - uVar15) + uVar22);
                pcVar17 = ppcStack_58[uVar22];
                ppcStack_58[uVar22] = ppcVar25[uVar15 + uVar19];
                ppcVar25[uVar15 + uVar19] = pcVar17;
                uVar22 = uVar22 - 1;
              } while (uVar15 < uVar22);
              iVar11 = (int)uStack_70;
            }
          }
        }
        auStackY_1d8[6] = 0x103aa6;
        init_alsa_device(iVar11,ppcStack_58,0x80,0x400,0,&psStack_f0,&sStack_138,&uStack_d0,
                         &sStack_cc);
        sStack_e8 = sStack_138;
        uVar22 = sStack_138 * 8 + 0xf & 0xfffffffffffffff0;
        pfStack_e0 = (float *)((long)&fStack_180 - uVar22);
        pfVar18 = (float *)((long)pfStack_e0 - uVar22);
        puStack_118 = (undefined1 *)pfVar18;
        puStack_f8 = (undefined1 *)&fStack_180;
        *(undefined8 *)((long)pfVar18 + -8) = 0x103af5;
        tcgetattr(0,(termios *)&previousflags);
        *(undefined8 *)((long)pfVar18 + -8) = 0x103b01;
        atexit(restoreterm);
        customflags.c_iflag = previousflags.c_iflag;
        customflags.c_oflag = previousflags.c_oflag;
        customflags.c_line = previousflags.c_line;
        customflags.c_cc[0] = previousflags.c_cc[0];
        customflags.c_cc[1] = previousflags.c_cc[1];
        customflags.c_cc[2] = previousflags.c_cc[2];
        customflags.c_cc[3] = previousflags.c_cc[3];
        customflags.c_cc[4] = previousflags.c_cc[4];
        customflags.c_cc[5] = previousflags.c_cc[5];
        customflags.c_cc[6] = previousflags.c_cc[6];
        customflags.c_cc[7] = previousflags.c_cc[7];
        customflags.c_cc[8] = previousflags.c_cc[8];
        customflags.c_cc[9] = previousflags.c_cc[9];
        customflags.c_cc[10] = previousflags.c_cc[10];
        customflags.c_cc[0xb] = previousflags.c_cc[0xb];
        customflags.c_cc[0xc] = previousflags.c_cc[0xc];
        customflags.c_cc[0xd] = previousflags.c_cc[0xd];
        customflags.c_cc[0xe] = previousflags.c_cc[0xe];
        customflags.c_cc[0xf] = previousflags.c_cc[0xf];
        customflags.c_cc[0x10] = previousflags.c_cc[0x10];
        customflags.c_cc[0x11] = previousflags.c_cc[0x11];
        customflags.c_cc[0x12] = previousflags.c_cc[0x12];
        customflags.c_cc[0x13] = previousflags.c_cc[0x13];
        customflags.c_cc[0x14] = previousflags.c_cc[0x14];
        customflags.c_cc[0x15] = previousflags.c_cc[0x15];
        customflags.c_cc[0x16] = previousflags.c_cc[0x16];
        customflags.c_cc[0x17] = previousflags.c_cc[0x17];
        customflags.c_cc[0x18] = previousflags.c_cc[0x18];
        customflags.c_cc[0x19] = previousflags.c_cc[0x19];
        customflags.c_cc[0x1a] = previousflags.c_cc[0x1a];
        customflags.c_cc[0x1b] = previousflags.c_cc[0x1b];
        customflags.c_cc[0x1c] = previousflags.c_cc[0x1c];
        customflags.c_cc[0x1d] = previousflags.c_cc[0x1d];
        customflags.c_cc[0x1e] = previousflags.c_cc[0x1e];
        customflags.c_cc[0x1f] = previousflags.c_cc[0x1f];
        customflags._49_3_ = previousflags._49_3_;
        customflags.c_ispeed = previousflags.c_ispeed;
        customflags.c_ospeed = previousflags.c_ospeed;
        customflags._8_8_ = previousflags._8_8_ & 0xffffffb5ffffffff | 0x4000000000;
        *(undefined8 *)((long)pfVar18 + -8) = 0x103b5b;
        tcsetattr(0,0,(termios *)&customflags);
        uStack_d8 = uVar15;
        if (uVar15 < uStack_88) {
          uStack_b0 = (ulong)uStack_d0;
          uStack_110 = (ulong)(uStack_d0 * 0xe10);
          fStack_b8 = (float)uStack_110;
          fStack_b4 = (float)uStack_b0;
          uStack_108 = (ulong)(uStack_d0 * 0x3c);
          uVar19 = 0;
          uStack_78 = 0;
          uVar22 = 0;
          do {
            bStack_39 = 0;
            pcVar17 = ppcStack_58[uVar15];
            uStack_a8 = uVar15;
            uStack_60 = uVar19;
            *(undefined8 *)((long)pfVar18 + -8) = 0x103be7;
            iVar11 = open(pcVar17,0);
            uStack_98 = uVar22;
            if (iVar11 != -1) {
              *(undefined8 *)((long)pfVar18 + -8) = 0x103c07;
              __len = lseek(iVar11,0,2);
              if (__len == 0xffffffffffffffff) {
                *(undefined8 *)((long)pfVar18 + -8) = 0x104324;
                main_cold_11();
                goto LAB_00104324;
              }
              *(undefined8 *)((long)pfVar18 + -8) = 0x103c2e;
              pcVar17 = (char *)mmap((void *)0x0,__len,1,1,iVar11,0);
              uVar15 = uStack_b0;
              if (pcVar17 == (char *)0xffffffffffffffff) {
LAB_001043bc:
                *(undefined8 *)((long)pfVar18 + -8) = 0x1043c1;
                main_cold_10();
LAB_001043c1:
                *(undefined8 *)((long)pfVar18 + -8) = 0x1043c6;
                main_cold_9();
LAB_001043c6:
                *(undefined8 *)((long)pfVar18 + -8) = 0x1043d2;
                main_cold_2();
LAB_001043d2:
                *(undefined8 *)((long)pfVar18 + -8) = 0x1043d9;
                main_cold_8();
LAB_001043d9:
                *(undefined8 *)((long)pfVar18 + -8) = 0x1043e0;
                main_cold_5();
LAB_001043e0:
                *(undefined8 *)((long)pfVar18 + -8) = 0x1043e7;
                main_cold_6();
                pfVar23 = pfVar18;
LAB_001043e7:
                *(undefined8 *)((long)pfVar23 + -8) = 0x1043f3;
                main_cold_1();
                pfVar4 = pfVar23;
                goto LAB_001043f3;
              }
              *(undefined8 *)((long)pfVar18 + -8) = 0x103c51;
              iVar13 = xm_create_context_safe(&pxStack_48,pcVar17,__len,(uint32_t)uVar15);
              if (iVar13 != 0) {
                if (iVar13 != 1) {
                  if (iVar13 == 2) {
                    *(undefined8 *)((long)pfVar18 + -8) = 0x1043b5;
                    main_cold_3();
LAB_001043b5:
                    *(undefined8 *)((long)pfVar18 + -8) = 0x1043bc;
                    main_cold_7();
                    goto LAB_001043bc;
                  }
                  goto LAB_001043c1;
                }
                *(undefined8 *)((long)pfVar18 + -8) = 0x104347;
                main_cold_4();
              }
              *(undefined8 *)((long)pfVar18 + -8) = 0x103c64;
              munmap(pcVar17,__len);
              *(undefined8 *)((long)pfVar18 + -8) = 0x103c6b;
              close(iVar11);
              pxVar3 = pxStack_48;
              if (pxStack_48 == (xm_context_t *)0x0) goto LAB_00104324;
              *(undefined8 *)((long)pfVar18 + -8) = 0x103c81;
              xm_set_max_loop_count(pxVar3,(uint8_t)uVar29);
              pxVar3 = pxStack_48;
              *(undefined8 *)((long)pfVar18 + -8) = 0x103c8a;
              uVar9 = xm_get_number_of_patterns(pxVar3);
              pxVar3 = pxStack_48;
              *(undefined8 *)((long)pfVar18 + -8) = 0x103c95;
              uVar10 = xm_get_number_of_channels(pxVar3);
              pxVar3 = pxStack_48;
              uStack_70 = CONCAT62(uStack_70._2_6_,uVar10);
              *(undefined8 *)((long)pfVar18 + -8) = 0x103ca2;
              uStack_62 = xm_get_module_length(pxVar3);
              pxVar3 = pxStack_48;
              *(undefined8 *)((long)pfVar18 + -8) = 0x103caf;
              xm_get_module_name(pxVar3);
              pxVar3 = pxStack_48;
              *(undefined8 *)((long)pfVar18 + -8) = 0x103cbb;
              pcVar17 = xm_get_tracker_name(pxVar3);
              *(undefined8 *)((long)pfVar18 + -8) = 0x103cd7;
              printf("==> Playing: %s\n");
              if (pcVar17 != (char *)0x0) {
                *(undefined8 *)((long)pfVar18 + -8) = 0x103ced;
                printf("==> Tracker: %s\n");
              }
              psStack_90 = psStack_f0;
              *(undefined8 *)((long)pfVar18 + -8) = 0x103cfd;
              iVar11 = snd_pcm_prepare();
              uVar19 = uStack_60;
              psVar2 = psStack_90;
              uVar22 = uStack_98;
              if (iVar11 < 0) {
                *(undefined8 *)((long)pfVar18 + -8) = 0x103d19;
                iVar11 = snd_pcm_recover(psVar2,iVar11,0);
                if (iVar11 < 0) goto LAB_001043d2;
              }
              uStack_100 = uStack_70 & 0xffff;
              uStack_bc = (uint)uStack_62;
              uStack_120 = (ulong)uVar9;
LAB_00103d40:
              pxVar3 = pxStack_48;
              if (uVar29 != 0) {
                *(undefined8 *)((long)pfVar18 + -8) = 0x103d4e;
                bVar5 = xm_get_loop_count(pxVar3);
                if (uVar29 <= bVar5) goto switchD_00103e29_caseD_6e;
              }
              get_command_f._112_8_ = 0;
              get_command_f._120_8_ = 0;
              get_command_f._96_8_ = 0;
              get_command_f._104_8_ = 0;
              get_command_f._80_8_ = 0;
              get_command_f._88_8_ = 0;
              get_command_f._64_8_ = 0;
              get_command_f._72_8_ = 0;
              get_command_f._48_8_ = 0;
              get_command_f._56_8_ = 0;
              get_command_f._32_8_ = 0;
              get_command_f._40_8_ = 0;
              get_command_f._16_8_ = 0;
              get_command_f._24_8_ = 0;
              get_command_f._0_8_ = 0;
              get_command_f._8_8_ = 0;
              *(undefined8 *)((long)pfVar18 + -8) = 0x103da4;
              iVar13 = fileno(_stdin);
              *(undefined8 *)((long)pfVar18 + -8) = 0x103dc6;
              iVar14 = fileno(_stdin);
              iVar11 = iVar14 + 0x3f;
              if (-1 < iVar14) {
                iVar11 = iVar14;
              }
              *(ulong *)(get_command_f + (long)(iVar11 >> 6) * 8) =
                   *(ulong *)(get_command_f + (long)(iVar11 >> 6) * 8) | 1L << ((byte)iVar13 & 0x3f)
              ;
              get_command_t._0_8_ = 0;
              get_command_t._8_8_ = 0;
              *(undefined8 *)((long)pfVar18 + -8) = 0x103dfe;
              iVar11 = select(1,(fd_set *)get_command_f,(fd_set *)0x0,(fd_set *)0x0,
                              (timeval *)get_command_t);
              uVar15 = uVar19;
              if (iVar11 < 1) goto LAB_0010402f;
              *(undefined8 *)((long)pfVar18 + -8) = 0x103e0b;
              uVar12 = getchar();
              pxVar3 = pxStack_48;
              psVar2 = psStack_90;
              if ((uVar12 & 0xff) < 0x3e) {
                if ((uVar12 & 0xff) == 0x20) {
                  uVar15 = uVar19 & 0xffffffff ^ 1;
                  if ((uVar19 & 1) != 0) {
                    uStack_78 = (uint)CONCAT71((uint7)(uint3)(uVar12 >> 8),1);
                    uVar22 = 0;
                    goto LAB_0010402f;
                  }
                  *(undefined8 *)((long)pfVar18 + -8) = 0x103fdf;
                  iVar11 = snd_pcm_pause(psVar2,1);
                  if (iVar11 < 0) {
                    *(undefined8 *)((long)pfVar18 + -8) = 0x103feb;
                    iVar11 = snd_pcm_drain(psVar2);
                    if (iVar11 < 0) {
                      *(undefined8 *)((long)pfVar18 + -8) = 0x103ffb;
                      iVar11 = snd_pcm_recover(psVar2,iVar11,0);
                      if (iVar11 < 0) goto LAB_001043e0;
                    }
                  }
                  uStack_175 = 0x2d;
                  _fStack_180 = 0x4150202d2d;
                  uStack_17b = 0x5355;
                  uStack_179 = 0x2d204445;
                  uVar22 = 0xffffffffffffffff;
                }
                else {
                  if ((uVar12 & 0xff) != 0x3c) goto switchD_00103e29_caseD_6d;
                  if (bStack_39 != 0) {
                    if (uVar29 != 0) {
                      *(undefined8 *)((long)pfVar18 + -8) = 0x103e6b;
                      xm_set_max_loop_count(pxVar3,'\0');
                    }
                    pxVar3 = pxStack_48;
                    uVar6 = bStack_39 - 1;
                    *(undefined8 *)((long)pfVar18 + -8) = 0x103e80;
                    xm_seek(pxVar3,uVar6,'\0',0);
                    uVar29 = 0;
                  }
                }
                goto LAB_0010402f;
              }
              switch(uVar12 & 0xff) {
              case 0x6c:
                loopcnt = uVar29 == 0;
                uVar29 = (ulong)loopcnt;
                *(undefined8 *)((long)pfVar18 + -8) = 0x103e3e;
                xm_set_max_loop_count(pxVar3,loopcnt);
                break;
              case 0x6d:
              case 0x6f:
switchD_00103e29_caseD_6d:
                if ((byte)((char)uVar12 - 0x30U) < 10) {
                  channel = ((ushort)uVar12 & 0xff) - 0x2f;
                }
                else {
                  if (0x15 < (byte)((char)uVar12 + 0xbfU)) break;
                  channel = ((ushort)uVar12 & 0xff) - 0x36;
                }
                if (channel <= (ushort)uStack_70) {
                  uStack_60 = uVar19;
                  *(undefined8 *)((long)pfVar18 + -8) = 0x103f17;
                  _Var7 = xm_mute_channel(pxVar3,channel,true);
                  *(undefined8 *)((long)pfVar18 + -8) = 0x103f27;
                  xm_mute_channel(pxVar3,channel,!_Var7);
                  _fStack_180 = 0x6e6e616843;
                  uStack_17b = 0x6c65;
                  uStack_179 = 0x203a73;
                  if ((ushort)uStack_70 != 0) {
                    uVar9 = 1;
                    uVar15 = 1;
                    do {
                      pxVar3 = pxStack_48;
                      *(undefined8 *)((long)pfVar18 + -8) = 0x103f68;
                      _Var7 = xm_mute_channel(pxVar3,uVar9,true);
                      pxVar3 = pxStack_48;
                      *(undefined8 *)((long)pfVar18 + -8) = 0x103f7a;
                      xm_mute_channel(pxVar3,uVar9,_Var7);
                      cVar8 = '.';
                      if (!_Var7) {
                        cVar8 = "Channels: "[(long)(int)uVar15 + 10];
                      }
                      *(char *)((long)&uStack_179 + uVar15 + 2) = cVar8;
                      uVar9 = uVar9 + 1;
                      uVar15 = (ulong)uVar9;
                    } while (uVar9 <= (ushort)uStack_70);
                  }
                  *(undefined1 *)((long)&uStack_179 + uStack_100 + 3) = 0;
                  uVar22 = uStack_a0 + uStack_b0;
                  uVar15 = uStack_60;
                }
                break;
              case 0x6e:
                goto switchD_00103e29_caseD_6e;
              case 0x70:
                if (uStack_a8 == uStack_d8) goto LAB_001043a4;
                uStack_a8 = uStack_a8 - 2;
switchD_00103e29_caseD_6e:
                *(undefined8 *)((long)pfVar18 + -8) = 0x1042c7;
                putchar(10);
                psVar2 = psStack_90;
                *(undefined8 *)((long)pfVar18 + -8) = 0x1042d3;
                iVar11 = snd_pcm_drop(psVar2);
                if (iVar11 < 0) {
                  *(undefined8 *)((long)pfVar18 + -8) = 0x1042e3;
                  iVar11 = snd_pcm_recover(psVar2,iVar11,0);
                  if (iVar11 < 0) goto LAB_001043d9;
                }
                pxVar3 = pxStack_48;
                *(undefined8 *)((long)pfVar18 + -8) = 0x1042f4;
                xm_free_context(pxVar3);
                goto LAB_001042f4;
              case 0x71:
                *(undefined8 *)((long)pfVar18 + -8) = 0x1043a4;
                putchar(10);
LAB_001043a4:
                *(undefined8 *)((long)pfVar18 + -8) = 0x1043ab;
                exit(0);
              default:
                if ((uVar12 & 0xff) != 0x3e) goto switchD_00103e29_caseD_6d;
                if (bStack_39 < uStack_62) {
                  uVar6 = bStack_39 + 1;
                  *(undefined8 *)((long)pfVar18 + -8) = 0x103ead;
                  xm_seek(pxVar3,uVar6,'\0',0);
                }
              }
LAB_0010402f:
              pxVar3 = pxStack_48;
              *(undefined8 *)((long)pfVar18 + -8) = 0x10404b;
              xm_get_position(pxVar3,&bStack_39,&bStack_4a,&bStack_49,&uStack_a0);
              pxVar3 = pxStack_48;
              *(undefined8 *)((long)pfVar18 + -8) = 0x10405c;
              xm_get_playing_speed(pxVar3,&uStack_7c,&uStack_7a);
              pxVar3 = pxStack_48;
              bVar5 = bStack_4a;
              if (uVar22 < uStack_a0) {
                uStack_c8 = (uint)uStack_7a;
                uStack_c4 = (uint)uStack_7c;
                uStack_c0 = (uint)bStack_39;
                uStack_128 = (ulong)bStack_49;
                uStack_98 = uVar22;
                *(undefined8 *)((long)pfVar18 + -8) = 0x1040a6;
                uVar9 = xm_get_number_of_rows(pxVar3,(ushort)bVar5);
                pxVar3 = pxStack_48;
                *(undefined8 *)((long)pfVar18 + -8) = 0x1040b2;
                bVar5 = xm_get_loop_count(pxVar3);
                fVar30 = (float)uStack_a0 / fStack_b8;
                uVar20 = uStack_a0 % uStack_110;
                uVar22 = uStack_108 & 0xffffffff;
                fVar31 = (float)(long)(uStack_a0 % uStack_108) / fStack_b4;
                uVar26 = (ulong)uStack_c8;
                uVar21 = (ulong)uStack_c4;
                uVar19 = (ulong)uStack_c0;
                uVar28 = (ulong)uStack_bc;
                uStack_130 = uVar29;
                uStack_60 = uVar15;
                *(long *)((long)pfVar18 + -0x10) =
                     (long)(((float)(long)(uStack_a0 % uStack_b0) * 100.0) / fStack_b4);
                *(long *)((long)pfVar18 + -0x18) = (long)fVar31;
                *(long *)((long)pfVar18 + -0x20) = (long)(float)((uVar20 & 0xffffffff) / uVar22);
                *(long *)((long)pfVar18 + -0x28) = (long)fVar30;
                uVar29 = uStack_130;
                *(ulong *)((long)pfVar18 + -0x30) = uStack_130;
                *(ulong *)((long)pfVar18 + -0x38) = (ulong)bVar5;
                *(ulong *)((long)pfVar18 + -0x40) = (ulong)uVar9;
                *(ulong *)((long)pfVar18 + -0x48) = uStack_128;
                *(ulong *)((long)pfVar18 + -0x50) = uStack_120;
                *(undefined8 *)((long)pfVar18 + -0x58) = 0x1041de;
                printf("\rSpd[%.2X/%.2X] Pos[%.2X/%.2X] Pat[%.2X/%.2X] Row[%.2X/%.2X] Loop[%.2X/%.2lX] %.2i:%.2i:%.2i.%.2i\r"
                       ,uVar26,uVar21,uVar19,uVar28);
                uVar22 = uStack_98;
                uVar15 = uStack_60;
              }
              else {
                *(undefined8 *)((long)pfVar18 + -8) = 0x1040ef;
                printf("\r%-*s\r",0x46,&fStack_180);
              }
              *(undefined8 *)((long)pfVar18 + -8) = 0x1041fc;
              fflush(_stdout);
              pxVar3 = pxStack_48;
              pfVar23 = pfStack_e0;
              sVar1 = sStack_e8;
              uVar19 = uVar15;
              if ((uVar15 & 1) == 0) {
                *(undefined8 *)((long)pfVar18 + -8) = 0x104228;
                xm_generate_samples(pxVar3,pfVar23,sVar1);
                psVar2 = psStack_90;
                if ((uStack_78 & 1) != 0) {
                  *(undefined8 *)((long)pfVar18 + -8) = 0x10423e;
                  snd_pcm_recover(psVar2,0,0);
                  *(undefined8 *)((long)pfVar18 + -8) = 0x104246;
                  iVar11 = snd_pcm_resume(psVar2);
                  if (iVar11 < 0) {
                    *(undefined8 *)((long)pfVar18 + -8) = 0x104252;
                    iVar11 = snd_pcm_prepare(psVar2);
                    if (iVar11 < 0) {
                      *(undefined8 *)((long)pfVar18 + -8) = 0x104262;
                      iVar11 = snd_pcm_recover(psVar2,iVar11,0);
                      if (iVar11 < 0) goto LAB_001043b5;
                    }
                  }
                }
                fVar30 = fStack_74;
                format_00 = sStack_cc;
                pfVar23 = pfStack_e0;
                sVar1 = sStack_e8;
                alsabuffer_00 = puStack_118;
                *(undefined8 *)((long)pfVar18 + -8) = 0x104292;
                play_floatbuffer(psVar2,format_00,sVar1,fVar30,pfVar23,alsabuffer_00);
                uStack_78 = 0;
              }
              else {
                *(undefined8 *)((long)pfVar18 + -8) = 0x10420c;
                usleep(10000);
              }
              goto LAB_00103d40;
            }
            *(undefined8 *)((long)pfVar18 + -8) = 0x104317;
            main_cold_12();
LAB_00104324:
            *(undefined8 *)((long)pfVar18 + -8) = 0x10432c;
            main_cold_13();
            uVar22 = uStack_98;
            uVar19 = uStack_60;
LAB_001042f4:
            uVar15 = uStack_a8 + 1;
          } while (uVar15 < uStack_88);
        }
        *(undefined8 *)((long)pfVar18 + -8) = 0x10435b;
        iVar11 = snd_pcm_close(psStack_f0);
        if (-1 < iVar11) {
          return;
        }
        *(undefined8 *)((long)pfVar18 + -8) = 0x10436b;
        iVar11 = snd_pcm_recover(psStack_f0,iVar11,0);
        if (-1 < iVar11) {
          return;
        }
        goto LAB_001043fb;
      }
    }
  }
LAB_001043f3:
  pfVar18 = pfVar4;
  *(undefined8 *)((long)pfVar18 + -8) = 0x1043fb;
  main_cold_15();
LAB_001043fb:
  *(code **)((long)pfVar18 + -8) = restoreterm;
  main_cold_14();
  tcsetattr(0,0,(termios *)&previousflags);
  return;
}

Assistant:

void play_floatbuffer(snd_pcm_t* device, snd_pcm_format_t format, size_t period_size, float preamp,
                   float* buffer, void* alsabuffer) {
	if(format == SND_PCM_FORMAT_FLOAT && preamp == 1.f) {
		CHECK_ALSA_CALL(snd_pcm_writei(device, buffer, period_size));
	} else {
		const unsigned int channels = 2;

		if(format == SND_PCM_FORMAT_S16) {
			for(size_t i = 0; i < period_size * channels; ++i) {
				((int16_t*)alsabuffer)[i] = (int16_t)(CLAMP((double)buffer[i] * preamp) * 32767.);
			}
		} else if(format == SND_PCM_FORMAT_S32) {
			for(size_t i = 0; i < period_size * channels; ++i) {
				((int32_t*)alsabuffer)[i] = (int32_t)(CLAMP((double)buffer[i] * preamp) * 2147483647.);
			}
		} else if(format == SND_PCM_FORMAT_FLOAT) {
			for(size_t i = 0; i < period_size * channels; ++i) {
				((float*)alsabuffer)[i] = buffer[i] * preamp;
			}
		}

		CHECK_ALSA_CALL(snd_pcm_writei(device, alsabuffer, period_size));
	}
}